

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
::streamReconstructedExpression
          (UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
           *this,ostream *os)

{
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>
  *in_RDX;
  type local_30;
  
  StringMaker<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>,void>
  ::
  convert<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>>
            (&local_30,
             (StringMaker<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>,void>
              *)this->m_lhs,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }